

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O2

bool __thiscall chrono::ChQuaternion<double>::Normalize(ChQuaternion<double> *this)

{
  double dVar1;
  
  dVar1 = Length(this);
  if (dVar1 < 2.2250738585072014e-308) {
    this->m_data[0] = 1.0;
    this->m_data[3] = 0.0;
    this->m_data[1] = 0.0;
    this->m_data[2] = 0.0;
  }
  else {
    Scale(this,1.0 / dVar1);
  }
  return 2.2250738585072014e-308 <= dVar1;
}

Assistant:

inline bool ChQuaternion<Real>::Normalize() {
    Real length = this->Length();
    if (length < std::numeric_limits<Real>::min()) {
        m_data[0] = 1;
        m_data[1] = 0;
        m_data[2] = 0;
        m_data[3] = 0;
        return false;
    }
    this->Scale(1 / length);
    return true;
}